

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

BinaryRegion *
flatbuffers::anon_unknown_46::MakeBinaryRegion
          (BinaryRegion *__return_storage_ptr__,uint64_t offset,uint64_t length,
          BinaryRegionType type,uint64_t array_length,uint64_t points_to_offset,
          BinaryRegionComment *comment)

{
  uint64_t points_to_offset_local;
  uint64_t array_length_local;
  BinaryRegionType type_local;
  uint64_t length_local;
  uint64_t offset_local;
  BinaryRegion *region;
  
  BinaryRegion::BinaryRegion(__return_storage_ptr__);
  __return_storage_ptr__->offset = offset;
  __return_storage_ptr__->length = length;
  __return_storage_ptr__->type = type;
  __return_storage_ptr__->array_length = array_length;
  __return_storage_ptr__->points_to_offset = points_to_offset;
  BinaryRegionComment::operator=(&__return_storage_ptr__->comment,comment);
  return __return_storage_ptr__;
}

Assistant:

static BinaryRegion MakeBinaryRegion(
    const uint64_t offset = 0, const uint64_t length = 0,
    const BinaryRegionType type = BinaryRegionType::Unknown,
    const uint64_t array_length = 0, const uint64_t points_to_offset = 0,
    BinaryRegionComment comment = {}) {
  BinaryRegion region;
  region.offset = offset;
  region.length = length;
  region.type = type;
  region.array_length = array_length;
  region.points_to_offset = points_to_offset;
  region.comment = std::move(comment);
  return region;
}